

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HwlocCpuInfo.cpp
# Opt level: O1

void xmrig::findCache<xmrig::HwlocCpuInfo::threads(unsigned_int)const::__0>
               (hwloc_obj_t obj,uint min,uint max,anon_class_8_1_4f99326f lambda)

{
  pointer *ppphVar1;
  uint uVar2;
  hwloc_obj *phVar3;
  iterator __position;
  int iVar4;
  hwloc_obj *in_RAX;
  ulong uVar5;
  hwloc_obj *local_38;
  
  if (obj->arity != 0) {
    uVar5 = 0;
    local_38 = in_RAX;
    do {
      iVar4 = hwloc_obj_type_is_cache(obj->children[uVar5]->type);
      if (iVar4 == 0) {
LAB_00177b4f:
        findCache<xmrig::HwlocCpuInfo::threads(unsigned_int)const::__0>
                  (obj->children[uVar5],min,max,lambda);
      }
      else {
        phVar3 = obj->children[uVar5];
        uVar2 = (phVar3->attr->numanode).page_types_len;
        if (uVar2 <= max && min <= uVar2) {
          __position._M_current =
               ((lambda.caches)->super__Vector_base<hwloc_obj_*,_std::allocator<hwloc_obj_*>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          local_38 = phVar3;
          if (__position._M_current ==
              ((lambda.caches)->super__Vector_base<hwloc_obj_*,_std::allocator<hwloc_obj_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<hwloc_obj*,std::allocator<hwloc_obj*>>::_M_realloc_insert<hwloc_obj*&>
                      ((vector<hwloc_obj*,std::allocator<hwloc_obj*>> *)lambda.caches,__position,
                       &local_38);
          }
          else {
            *__position._M_current = phVar3;
            ppphVar1 = &((lambda.caches)->
                        super__Vector_base<hwloc_obj_*,_std::allocator<hwloc_obj_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *ppphVar1 = *ppphVar1 + 1;
          }
          if (uVar2 <= max && min <= uVar2) goto LAB_00177b4f;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < obj->arity);
  }
  return;
}

Assistant:

static inline void findCache(hwloc_obj_t obj, unsigned min, unsigned max, func lambda)
{
    for (size_t i = 0; i < obj->arity; i++) {
        if (isCacheObject(obj->children[i])) {
            const unsigned depth = obj->children[i]->attr->cache.depth;
            if (depth < min || depth > max) {
                continue;
            }

            lambda(obj->children[i]);
        }

        findCache(obj->children[i], min, max, lambda);
    }
}